

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O0

ScanStatus * __thiscall
Sinclair::ZX8081::Video::get_scaled_scan_status(ScanStatus *__return_storage_ptr__,Video *this)

{
  ScanStatus local_38;
  Video *local_10;
  Video *this_local;
  
  local_10 = this;
  Outputs::CRT::CRT::get_scaled_scan_status(&local_38,&this->crt_);
  Outputs::Display::ScanStatus::operator/(__return_storage_ptr__,&local_38,2.0);
  return __return_storage_ptr__;
}

Assistant:

Outputs::Display::ScanStatus Video::get_scaled_scan_status() const {
	return crt_.get_scaled_scan_status() / 2.0f;
}